

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O1

int mbedtls_timing_self_test(int verbose)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined4 uVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  char *__s;
  long lVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  timeval now_1;
  mbedtls_timing_delay_context ctx;
  mbedtls_timing_hr_time hires;
  
  if (verbose != 0) {
    puts("  TIMING tests note: will take some time!");
    printf("  TIMING test #1 (set_alarm / get_timer): ");
  }
  gettimeofday((timeval *)&hires,(__timezone_ptr_t)0x0);
  mbedtls_timing_alarmed = 0;
  signal(0xe,sighandler);
  alarm(1);
  do {
  } while (mbedtls_timing_alarmed == 0);
  gettimeofday((timeval *)&ctx,(__timezone_ptr_t)0x0);
  lVar11 = (ctx.timer.opaque._0_8_ - hires.opaque._0_8_) * 1000;
  lVar15 = (long)(ctx.timer.opaque._8_8_ - hires.opaque._8_8_) / 1000;
  lVar13 = lVar15 + lVar11;
  if ((lVar11 + lVar15) - 0x5ddU < 0xfffffffffffffd43) {
    if (verbose == 0) {
      return 1;
    }
    printf("failed at line %d\n");
    printf(" cycles=%lu ratio=%lu millisecs=%lu secs=%lu hardfail=%d a=%lu b=%lu\n",0,0,lVar13,1,0,0
           ,0);
    gettimeofday((timeval *)&ctx,(__timezone_ptr_t)0x0);
    lVar13 = (long)(ctx.timer.opaque._8_8_ - hires.opaque._8_8_) / 1000 +
             (ctx.timer.opaque._0_8_ - hires.opaque._0_8_) * 1000;
    gettimeofday((timeval *)&now_1,(__timezone_ptr_t)0x0);
    lVar15 = (now_1.tv_usec - ctx.timer.opaque._8_8_) / 1000 +
             (now_1.tv_sec - ctx.timer.opaque._0_8_) * 1000;
  }
  else {
    if (verbose != 0) {
      puts("passed");
      printf("  TIMING test #2 (set/get_delay        ): ");
    }
    ctx.int_ms = 800;
    ctx.fin_ms = 0x4b0;
    gettimeofday((timeval *)&ctx,(__timezone_ptr_t)0x0);
    busy_msleep(600);
    iVar8 = mbedtls_timing_get_delay(&ctx);
    if (iVar8 == 0) {
      busy_msleep(300);
      iVar8 = mbedtls_timing_get_delay(&ctx);
      if (iVar8 == 1) {
        busy_msleep(400);
        iVar8 = mbedtls_timing_get_delay(&ctx);
        if (iVar8 == 2) {
          ctx.int_ms = 0;
          ctx.fin_ms = 0;
          busy_msleep(200);
          iVar8 = mbedtls_timing_get_delay(&ctx);
          if (iVar8 == -1) {
            uVar7 = extraout_var;
            if (verbose != 0) {
              puts("passed");
              printf("  TIMING test #3 (hardclock / get_timer): ");
              uVar7 = extraout_var_00;
            }
            iVar8 = 0;
            do {
              uVar12 = rdtsc();
              busy_msleep(1);
              uVar14 = rdtsc();
              uVar12 = (uVar14 & 0xffffffff00000000 | CONCAT44(extraout_var_01,(int)uVar14)) -
                       (uVar12 & 0xffffffff00000000 | CONCAT44(uVar7,(int)uVar12));
              auVar3._8_8_ = 0;
              auVar3._0_8_ = uVar12;
              auVar4 = auVar3 * ZEXT816(0xcccccccccccccccd);
              auVar6._8_8_ = 4;
              auVar6._0_8_ = 0xcccccccccccccccd;
              uVar14 = 2;
              while( true ) {
                uVar10 = rdtsc();
                busy_msleep(uVar14);
                uVar5 = rdtsc();
                auVar1._8_8_ = 0;
                auVar1._0_8_ = uVar14;
                auVar2._8_8_ = 0;
                auVar2._0_8_ = (CONCAT44(extraout_var_02,(int)uVar5) | uVar5 & 0xffffffff00000000) -
                               (uVar10 & 0xffffffff00000000 | CONCAT44(auVar4._4_4_,(int)uVar10));
                uVar10 = SUB168(auVar2 / auVar1,0);
                auVar4._8_8_ = SUB168(auVar2 % auVar1,0);
                auVar4._0_8_ = uVar10;
                if ((uVar10 < uVar12 - uVar12 / 5) || (SUB168(auVar3 * auVar6,8) >> 2 < uVar10))
                break;
                uVar14 = uVar14 + 1;
                if (uVar14 == 5) {
                  if (verbose == 0) {
                    return 0;
                  }
                  __s = "passed";
                  goto LAB_0011d894;
                }
              }
              uVar7 = 0;
              bVar16 = iVar8 != 0;
              iVar8 = iVar8 + 1;
              if (bVar16) {
                if (verbose != 0) {
                  __s = "failed (ignored)";
LAB_0011d894:
                  puts(__s);
                  putchar(10);
                }
                return 0;
              }
            } while( true );
          }
        }
      }
    }
    if (verbose == 0) {
      return 1;
    }
    printf("failed at line %d\n");
    printf(" cycles=%lu ratio=%lu millisecs=%lu secs=%lu hardfail=%d a=%lu b=%lu\n",0,0,lVar13,1,0,
           800,400);
    gettimeofday((timeval *)&now_1,(__timezone_ptr_t)0x0);
    lVar13 = (now_1.tv_usec - hires.opaque._8_8_) / 1000 +
             (now_1.tv_sec - hires.opaque._0_8_) * 1000;
    gettimeofday((timeval *)&now_1,(__timezone_ptr_t)0x0);
    lVar15 = (now_1.tv_usec - ctx.timer.opaque._8_8_) / 1000 +
             (now_1.tv_sec - ctx.timer.opaque._0_8_) * 1000;
  }
  uVar9 = mbedtls_timing_get_delay(&ctx);
  printf(" elapsed(hires)=%lu elapsed(ctx)=%lu status(ctx)=%d\n",lVar13,lVar15,(ulong)uVar9);
  return 1;
}

Assistant:

int mbedtls_timing_self_test( int verbose )
{
    unsigned long cycles = 0, ratio = 0;
    unsigned long millisecs = 0, secs = 0;
    int hardfail = 0;
    struct mbedtls_timing_hr_time hires;
    uint32_t a = 0, b = 0;
    mbedtls_timing_delay_context ctx;

    if( verbose != 0 )
        mbedtls_printf( "  TIMING tests note: will take some time!\n" );

    if( verbose != 0 )
        mbedtls_printf( "  TIMING test #1 (set_alarm / get_timer): " );

    {
        secs = 1;

        (void) mbedtls_timing_get_timer( &hires, 1 );

        mbedtls_set_alarm( (int) secs );
        while( !mbedtls_timing_alarmed )
            ;

        millisecs = mbedtls_timing_get_timer( &hires, 0 );

        /* For some reason on Windows it looks like alarm has an extra delay
         * (maybe related to creating a new thread). Allow some room here. */
        if( millisecs < 800 * secs || millisecs > 1200 * secs + 300 )
            FAIL;
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    if( verbose != 0 )
        mbedtls_printf( "  TIMING test #2 (set/get_delay        ): " );

    {
        a = 800;
        b = 400;
        mbedtls_timing_set_delay( &ctx, a, a + b );          /* T = 0 */

        busy_msleep( a - a / 4 );                      /* T = a - a/4 */
        if( mbedtls_timing_get_delay( &ctx ) != 0 )
            FAIL;

        busy_msleep( a / 4 + b / 4 );                  /* T = a + b/4 */
        if( mbedtls_timing_get_delay( &ctx ) != 1 )
            FAIL;

        busy_msleep( b );                          /* T = a + b + b/4 */
        if( mbedtls_timing_get_delay( &ctx ) != 2 )
            FAIL;
    }

    mbedtls_timing_set_delay( &ctx, 0, 0 );
    busy_msleep( 200 );
    if( mbedtls_timing_get_delay( &ctx ) != -1 )
        FAIL;

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

    if( verbose != 0 )
        mbedtls_printf( "  TIMING test #3 (hardclock / get_timer): " );

    /*
     * Allow one failure for possible counter wrapping.
     * On a 4Ghz 32-bit machine the cycle counter wraps about once per second;
     * since the whole test is about 10ms, it shouldn't happen twice in a row.
     */

hard_test:
    if( hardfail > 1 )
    {
        if( verbose != 0 )
            mbedtls_printf( "failed (ignored)\n" );

        goto hard_test_done;
    }

    /* Get a reference ratio cycles/ms */
    millisecs = 1;
    cycles = mbedtls_timing_hardclock();
    busy_msleep( millisecs );
    cycles = mbedtls_timing_hardclock() - cycles;
    ratio = cycles / millisecs;

    /* Check that the ratio is mostly constant */
    for( millisecs = 2; millisecs <= 4; millisecs++ )
    {
        cycles = mbedtls_timing_hardclock();
        busy_msleep( millisecs );
        cycles = mbedtls_timing_hardclock() - cycles;

        /* Allow variation up to 20% */
        if( cycles / millisecs < ratio - ratio / 5 ||
            cycles / millisecs > ratio + ratio / 5 )
        {
            hardfail++;
            goto hard_test;
        }
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );

hard_test_done:

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}